

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuTestLog.hpp
# Opt level: O2

MessageBuilder * __thiscall tcu::MessageBuilder::operator<<(MessageBuilder *this,char **value)

{
  std::operator<<((ostream *)&this->m_str,*value);
  return this;
}

Assistant:

inline MessageBuilder& MessageBuilder::operator<< (const T& value)
{
	// Overload stream operator to implement custom format
	m_str << value;
	return *this;
}